

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.cpp
# Opt level: O1

bool __thiscall MeCab::StringBuffer::reserve(StringBuffer *this,size_t length)

{
  size_t __n;
  char *pcVar1;
  char *__dest;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  __n = this->size_;
  uVar2 = this->alloc_size_;
  uVar3 = length + __n;
  if (this->is_delete_ == false) {
    bVar4 = uVar3 < uVar2;
    this->error_ = !bVar4;
  }
  else {
    bVar4 = true;
    if (uVar2 <= uVar3) {
      if (uVar2 == 0) {
        this->alloc_size_ = 0x2000;
        pcVar1 = (char *)operator_new__(0x2000);
        this->ptr_ = pcVar1;
      }
      uVar2 = this->alloc_size_;
      do {
        uVar2 = uVar2 * 2;
      } while (uVar2 <= uVar3);
      this->alloc_size_ = uVar2;
      __dest = (char *)operator_new__(uVar2);
      pcVar1 = this->ptr_;
      memcpy(__dest,pcVar1,__n);
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      this->ptr_ = __dest;
    }
  }
  return bVar4;
}

Assistant:

bool StringBuffer::reserve(size_t length) {
  if (!is_delete_) {
    error_ = (size_ + length >= alloc_size_);
    return (!error_);
  }

  if (size_ + length >= alloc_size_) {
    if (alloc_size_ == 0) {
      alloc_size_ = DEFAULT_ALLOC_SIZE;
      ptr_ = new char[alloc_size_];
    }
    size_t len = size_ + length;
    do {
      alloc_size_ *= 2;
    } while (len >= alloc_size_);
    char *new_ptr = new char[alloc_size_];
    std::memcpy(new_ptr, ptr_, size_);
    delete [] ptr_;
    ptr_ = new_ptr;
  }

  return true;
}